

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

DAngle __thiscall UDMFParserBase::CheckAngle(UDMFParserBase *this,char *key)

{
  char *in_RDX;
  double dVar1;
  DAngle DVar2;
  
  dVar1 = CheckFloat((UDMFParserBase *)key,in_RDX);
  DVar2.Degrees =
       (double)((ulong)(dVar1 * 11930464.711111112 + 6755399441055744.0) & 0xffffffff) *
       8.381903171539307e-08;
  (this->sc).String = (char *)DVar2.Degrees;
  return (DAngle)DVar2.Degrees;
}

Assistant:

DAngle UDMFParserBase::CheckAngle(const char *key)
{
	return DAngle(CheckFloat(key)).Normalized360();
}